

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-traversal.h
# Opt level: O2

void wasm::PostWalker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::scan
               (AllocationFinder *self,Expression **currp)

{
  Expression *this;
  Block *pBVar1;
  Resume *pRVar2;
  StackSwitch *pSVar3;
  Expression **ppEVar4;
  AtomicWait *pAVar5;
  ContBind *pCVar6;
  TryTable *pTVar7;
  GlobalSet *pGVar8;
  CallRef *pCVar9;
  StructGet *pSVar10;
  Call *pCVar11;
  AtomicCmpxchg *pAVar12;
  CallIndirect *pCVar13;
  Load *pLVar14;
  Try *pTVar15;
  Break *pBVar16;
  Switch *pSVar17;
  ArrayNew *pAVar18;
  Return *pRVar19;
  StructNew *pSVar20;
  SIMDLoad *pSVar21;
  Suspend *pSVar22;
  Store *pSVar23;
  Throw *pTVar24;
  MemoryCopy *pMVar25;
  ResumeThrow *pRVar26;
  TupleMake *pTVar27;
  StringNew *pSVar28;
  ArrayNewFixed *pAVar29;
  Expression **currp_00;
  Expression **currp_01;
  Expression **extraout_RDX;
  Expression **currp_02;
  Expression **extraout_RDX_00;
  Expression **extraout_RDX_01;
  Expression **extraout_RDX_02;
  Expression **currp_03;
  Expression **currp_04;
  Expression **currp_05;
  ulong uVar30;
  
  this = *currp;
  switch(this->_id) {
  case InvalidId:
  case NumExpressionIds:
    handle_unreachable("unexpected expression type",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-delegations-fields.def"
                       ,0x103);
  case BlockId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitBlock,currp)
    ;
    pBVar1 = Expression::cast<wasm::Block>(this);
    uVar30 = (ulong)(uint)(pBVar1->list).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pBVar1->list).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case IfId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitIf,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::If>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)&pMVar25->size,currp_02);
    goto LAB_00a21cd8;
  case LoopId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitLoop,currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::Loop>(this);
    goto LAB_00a218b1;
  case BreakId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitBreak,currp)
    ;
    pBVar16 = Expression::cast<wasm::Break>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)&pBVar16->condition,currp_01);
    ppEVar4 = &pBVar16->value;
    currp_03 = extraout_RDX;
    goto LAB_00a217ab;
  case SwitchId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSwitch,currp
              );
    pSVar17 = Expression::cast<wasm::Switch>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pSVar17->condition);
    ppEVar4 = &pSVar17->value;
    currp_03 = extraout_RDX_00;
    goto LAB_00a217ab;
  case CallId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitCall,currp);
    pCVar11 = Expression::cast<wasm::Call>(this);
    uVar30 = (ulong)(uint)(pCVar11->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar11->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case CallIndirectId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitCallIndirect
               ,currp);
    pCVar13 = Expression::cast<wasm::CallIndirect>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pCVar13->target);
    uVar30 = (ulong)(uint)(pCVar13->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar13->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case LocalGetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitLocalGet,
               currp);
    Expression::cast<wasm::LocalGet>(this);
    return;
  case LocalSetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitLocalSet,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::LocalSet>(this);
    goto LAB_00a21b09;
  case GlobalGetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitGlobalGet,
               currp);
    Expression::cast<wasm::GlobalGet>(this);
    return;
  case GlobalSetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitGlobalSet,
               currp);
    pGVar8 = Expression::cast<wasm::GlobalSet>(this);
    goto LAB_00a218b1;
  case LoadId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitLoad,currp);
    pLVar14 = Expression::cast<wasm::Load>(this);
    ppEVar4 = &pLVar14->ptr;
    goto LAB_00a21cf0;
  case StoreId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStore,currp)
    ;
    pSVar23 = Expression::cast<wasm::Store>(this);
    goto LAB_00a21ad0;
  case ConstId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitConst,currp)
    ;
    Expression::cast<wasm::Const>(this);
    return;
  case UnaryId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitUnary,currp)
    ;
    pSVar10 = (StructGet *)Expression::cast<wasm::Unary>(this);
    goto LAB_00a21b09;
  case BinaryId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitBinary,currp
              );
    pAVar5 = (AtomicWait *)Expression::cast<wasm::Binary>(this);
    goto LAB_00a21a72;
  case SelectId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSelect,currp
              );
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::Select>(this);
    goto LAB_00a21cc9;
  case DropId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitDrop,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::Drop>(this);
    goto LAB_00a21942;
  case ReturnId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitReturn,currp
              );
    pRVar19 = Expression::cast<wasm::Return>(this);
    ppEVar4 = &pRVar19->value;
    currp_03 = extraout_RDX_02;
    goto LAB_00a217ab;
  case MemorySizeId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitMemorySize,
               currp);
    Expression::cast<wasm::MemorySize>(this);
    return;
  case MemoryGrowId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitMemoryGrow,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::MemoryGrow>(this);
    goto LAB_00a21942;
  case NopId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitNop,currp);
    Expression::cast<wasm::Nop>(this);
    return;
  case UnreachableId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitUnreachable,
               currp);
    Expression::cast<wasm::Unreachable>(this);
    return;
  case AtomicRMWId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitAtomicRMW,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::AtomicRMW>(this);
    goto LAB_00a21b50;
  case AtomicCmpxchgId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitAtomicCmpxchg,currp);
    pAVar12 = Expression::cast<wasm::AtomicCmpxchg>(this);
    goto LAB_00a21b41;
  case AtomicWaitId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitAtomicWait,
               currp);
    pAVar5 = Expression::cast<wasm::AtomicWait>(this);
    goto LAB_00a218d1;
  case AtomicNotifyId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitAtomicNotify
               ,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::AtomicNotify>(this);
    goto LAB_00a21a72;
  case AtomicFenceId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitAtomicFence,
               currp);
    Expression::cast<wasm::AtomicFence>(this);
    return;
  case SIMDExtractId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDExtract,
               currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::SIMDExtract>(this);
    goto LAB_00a21b09;
  case SIMDReplaceId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDReplace,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDReplace>(this);
    ppEVar4 = &pAVar5->timeout;
    goto LAB_00a21a80;
  case SIMDShuffleId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDShuffle,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::SIMDShuffle>(this);
    goto LAB_00a21cd8;
  case SIMDTernaryId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDTernary,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDTernary>(this);
    goto LAB_00a218d1;
  case SIMDShiftId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDShift,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::SIMDShift>(this);
    goto LAB_00a21a72;
  case SIMDLoadId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSIMDLoad,
               currp);
    pSVar21 = Expression::cast<wasm::SIMDLoad>(this);
    goto LAB_00a21a0c;
  case SIMDLoadStoreLaneId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitSIMDLoadStoreLane,currp);
    pSVar23 = (Store *)Expression::cast<wasm::SIMDLoadStoreLane>(this);
LAB_00a21ad0:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pSVar23->value);
    ppEVar4 = &pSVar23->ptr;
    goto LAB_00a21cf0;
  case MemoryInitId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitMemoryInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::MemoryInit>(this);
    goto LAB_00a21b41;
  case DataDropId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitDataDrop,
               currp);
    Expression::cast<wasm::DataDrop>(this);
    return;
  case MemoryCopyId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitMemoryCopy,
               currp);
    pMVar25 = Expression::cast<wasm::MemoryCopy>(this);
    goto LAB_00a21cc9;
  case MemoryFillId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitMemoryFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::MemoryFill>(this);
    goto LAB_00a21cc9;
  case PopId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitPop,currp);
    Expression::cast<wasm::Pop>(this);
    return;
  case RefNullId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefNull,
               currp);
    Expression::cast<wasm::RefNull>(this);
    return;
  case RefIsNullId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefIsNull,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefIsNull>(this);
    goto LAB_00a21942;
  case RefFuncId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefFunc,
               currp);
    Expression::cast<wasm::RefFunc>(this);
    return;
  case RefEqId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefEq,currp)
    ;
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::RefEq>(this);
    goto LAB_00a21cd8;
  case TableGetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableGet,
               currp);
    pGVar8 = (GlobalSet *)Expression::cast<wasm::TableGet>(this);
LAB_00a218b1:
    ppEVar4 = &pGVar8->value;
    goto LAB_00a21cf0;
  case TableSetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableSet,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableSet>(this);
    goto LAB_00a21b50;
  case TableSizeId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableSize,
               currp);
    Expression::cast<wasm::TableSize>(this);
    return;
  case TableGrowId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableGrow,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableGrow>(this);
    goto LAB_00a21b50;
  case TableFillId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableFill,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableFill>(this);
    goto LAB_00a21b41;
  case TableCopyId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::TableCopy>(this);
    goto LAB_00a21cc9;
  case TableInitId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTableInit,
               currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::TableInit>(this);
    goto LAB_00a21b41;
  case TryId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTry,currp);
    pTVar15 = Expression::cast<wasm::Try>(this);
    uVar30 = (ulong)(uint)(pTVar15->catchBodies).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar15->catchBodies).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    ppEVar4 = &pTVar15->body;
    goto LAB_00a21cf0;
  case TryTableId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTryTable,
               currp);
    pTVar7 = Expression::cast<wasm::TryTable>(this);
    goto LAB_00a21942;
  case ThrowId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitThrow,currp)
    ;
    pTVar24 = Expression::cast<wasm::Throw>(this);
    uVar30 = (ulong)(uint)(pTVar24->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar24->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case RethrowId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRethrow,
               currp);
    Expression::cast<wasm::Rethrow>(this);
    return;
  case ThrowRefId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitThrowRef,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ThrowRef>(this);
    goto LAB_00a21942;
  case TupleMakeId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTupleMake,
               currp);
    pTVar27 = Expression::cast<wasm::TupleMake>(this);
    uVar30 = (ulong)(uint)(pTVar27->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pTVar27->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case TupleExtractId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitTupleExtract
               ,currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::TupleExtract>(this);
    goto LAB_00a21942;
  case RefI31Id:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefI31,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::RefI31>(this);
    goto LAB_00a21942;
  case I31GetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitI31Get,currp
              );
    pTVar7 = (TryTable *)Expression::cast<wasm::I31Get>(this);
    goto LAB_00a21942;
  case CallRefId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitCallRef,
               currp);
    pCVar9 = Expression::cast<wasm::CallRef>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pCVar9->target);
    uVar30 = (ulong)(uint)(pCVar9->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar9->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case RefTestId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefTest,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefTest>(this);
    goto LAB_00a21942;
  case RefCastId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefCast,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::RefCast>(this);
    goto LAB_00a21942;
  case BrOnId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitBrOn,currp);
    pSVar21 = (SIMDLoad *)Expression::cast<wasm::BrOn>(this);
LAB_00a21a0c:
    ppEVar4 = &pSVar21->ptr;
    goto LAB_00a21cf0;
  case StructNewId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStructNew,
               currp);
    pSVar20 = Expression::cast<wasm::StructNew>(this);
    uVar30 = (ulong)(uint)(pSVar20->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar20->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case StructGetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStructGet,
               currp);
    pSVar10 = Expression::cast<wasm::StructGet>(this);
    goto LAB_00a21b09;
  case StructSetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStructSet,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructSet>(this);
    goto LAB_00a21a72;
  case StructRMWId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStructRMW,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructRMW>(this);
    goto LAB_00a21a72;
  case StructCmpxchgId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitStructCmpxchg,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StructCmpxchg>(this);
LAB_00a218d1:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pAVar5->timeout);
    ppEVar4 = &pAVar5->expected;
    goto LAB_00a21a80;
  case ArrayNewId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayNew,
               currp);
    pAVar18 = Expression::cast<wasm::ArrayNew>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pAVar18->size);
    ppEVar4 = &pAVar18->init;
    currp_03 = extraout_RDX_01;
LAB_00a217ab:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)ppEVar4,currp_03);
    return;
  case ArrayNewDataId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayNewData
               ,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewData>(this);
    goto LAB_00a21b50;
  case ArrayNewElemId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayNewElem
               ,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayNewElem>(this);
    goto LAB_00a21b50;
  case ArrayNewFixedId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitArrayNewFixed,currp);
    pAVar29 = Expression::cast<wasm::ArrayNewFixed>(this);
    uVar30 = (ulong)(uint)(pAVar29->values).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pAVar29->values).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ArrayGetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayGet,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayGet>(this);
    goto LAB_00a21cd8;
  case ArraySetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArraySet,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArraySet>(this);
    goto LAB_00a21cc9;
  case ArrayLenId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayLen,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ArrayLen>(this);
    goto LAB_00a21942;
  case ArrayCopyId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayCopy,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayCopy>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               (Expression **)&(pMVar25->destMemory).super_IString.str._M_str);
    goto LAB_00a21cba;
  case ArrayFillId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitArrayFill,
               currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::ArrayFill>(this);
LAB_00a21cba:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               (Expression **)&pMVar25->destMemory);
    goto LAB_00a21cc9;
  case ArrayInitDataId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitArrayInitData,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitData>(this);
    goto LAB_00a21441;
  case ArrayInitElemId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitArrayInitElem,currp);
    pAVar12 = (AtomicCmpxchg *)Expression::cast<wasm::ArrayInitElem>(this);
LAB_00a21441:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               (Expression **)&pAVar12->memory);
LAB_00a21b41:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pAVar12->replacement);
LAB_00a21b50:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pAVar12->expected);
    ppEVar4 = &pAVar12->ptr;
    goto LAB_00a21cf0;
  case RefAsId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitRefAs,currp)
    ;
    pSVar10 = (StructGet *)Expression::cast<wasm::RefAs>(this);
    goto LAB_00a21b09;
  case StringNewId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStringNew,
               currp);
    pSVar28 = Expression::cast<wasm::StringNew>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)&pSVar28->end,currp_04);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)&pSVar28->start,currp_05);
    ppEVar4 = &pSVar28->ref;
    goto LAB_00a21cf0;
  case StringConstId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStringConst,
               currp);
    Expression::cast<wasm::StringConst>(this);
    return;
  case StringMeasureId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitStringMeasure,currp);
    pSVar10 = (StructGet *)Expression::cast<wasm::StringMeasure>(this);
LAB_00a21b09:
    ppEVar4 = &pSVar10->ref;
    goto LAB_00a21cf0;
  case StringEncodeId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStringEncode
               ,currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEncode>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::maybePushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               (TaskFunc)&pAVar5->timeout,currp_00);
    ppEVar4 = &pAVar5->expected;
    goto LAB_00a21a80;
  case StringConcatId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStringConcat
               ,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringConcat>(this);
    goto LAB_00a21cd8;
  case StringEqId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStringEq,
               currp);
    pAVar5 = (AtomicWait *)Expression::cast<wasm::StringEq>(this);
LAB_00a21a72:
    ppEVar4 = &pAVar5->expected;
LAB_00a21a80:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,ppEVar4
              );
    ppEVar4 = &pAVar5->ptr;
    goto LAB_00a21cf0;
  case StringWTF16GetId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitStringWTF16Get,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringWTF16Get>(this);
    goto LAB_00a21cd8;
  case StringSliceWTFId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::
               doVisitStringSliceWTF,currp);
    pMVar25 = (MemoryCopy *)Expression::cast<wasm::StringSliceWTF>(this);
LAB_00a21cc9:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pMVar25->size);
LAB_00a21cd8:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pMVar25->source);
    ppEVar4 = &pMVar25->dest;
    goto LAB_00a21cf0;
  case ContNewId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitContNew,
               currp);
    pTVar7 = (TryTable *)Expression::cast<wasm::ContNew>(this);
LAB_00a21942:
    ppEVar4 = &pTVar7->body;
LAB_00a21cf0:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,ppEVar4
              );
    return;
  case ContBindId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitContBind,
               currp);
    pCVar6 = Expression::cast<wasm::ContBind>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pCVar6->cont);
    uVar30 = (ulong)(uint)(pCVar6->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pCVar6->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case SuspendId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitSuspend,
               currp);
    pSVar22 = Expression::cast<wasm::Suspend>(this);
    uVar30 = (ulong)(uint)(pSVar22->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar22->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ResumeId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitResume,currp
              );
    pRVar2 = Expression::cast<wasm::Resume>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pRVar2->cont);
    uVar30 = (ulong)(uint)(pRVar2->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar2->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case ResumeThrowId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitResumeThrow,
               currp);
    pRVar26 = Expression::cast<wasm::ResumeThrow>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pRVar26->cont);
    uVar30 = (ulong)(uint)(pRVar26->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pRVar26->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
    break;
  case StackSwitchId:
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,
               Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::doVisitStackSwitch,
               currp);
    pSVar3 = Expression::cast<wasm::StackSwitch>(this);
    Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
              ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
               &pSVar3->cont);
    uVar30 = (ulong)(uint)(pSVar3->operands).
                          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                          .usedElements;
    while (0 < (int)uVar30) {
      uVar30 = uVar30 - 1;
      ppEVar4 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::operator[]
                          (&(pSVar3->operands).
                            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
                           ,uVar30);
      Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_>::pushTask
                ((Walker<AllocationFinder,_wasm::Visitor<AllocationFinder,_void>_> *)self,scan,
                 ppEVar4);
    }
  }
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

#define DELEGATE_ID curr->_id

#define DELEGATE_START(id)                                                     \
  self->pushTask(SubType::doVisit##id, currp);                                 \
  [[maybe_unused]] auto* cast = curr->cast<id>();

#define DELEGATE_GET_FIELD(id, field) cast->field

#define DELEGATE_FIELD_CHILD(id, field)                                        \
  self->pushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_OPTIONAL_CHILD(id, field)                               \
  self->maybePushTask(SubType::scan, &cast->field);

#define DELEGATE_FIELD_INT(id, field)
#define DELEGATE_FIELD_LITERAL(id, field)
#define DELEGATE_FIELD_NAME(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_DEF(id, field)
#define DELEGATE_FIELD_SCOPE_NAME_USE(id, field)
#define DELEGATE_FIELD_TYPE(id, field)
#define DELEGATE_FIELD_HEAPTYPE(id, field)
#define DELEGATE_FIELD_ADDRESS(id, field)

#include "wasm-delegations-fields.def"
  }